

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O0

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::anon_unknown_0::TypeMerging::getPublicChildren
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          TypeMerging *this,HeapType type)

{
  bool bVar1;
  reference pHVar2;
  size_type sVar3;
  HeapType local_70;
  HeapType child;
  iterator __end2;
  iterator __begin2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_48;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *local_30;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2;
  TypeMerging *local_20;
  TypeMerging *this_local;
  HeapType type_local;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *publicChildren;
  
  __range2._7_1_ = 0;
  local_20 = this;
  this_local = (TypeMerging *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(__return_storage_ptr__);
  HeapType::getHeapTypeChildren(&local_48,(HeapType *)&this_local);
  local_30 = &local_48;
  __end2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(local_30);
  child.id = (uintptr_t)std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(local_30);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                     *)&child), bVar1) {
    pHVar2 = __gnu_cxx::
             __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
             ::operator*(&__end2);
    local_70.id = pHVar2->id;
    bVar1 = HeapType::isBasic(&local_70);
    if ((!bVar1) &&
       (sVar3 = std::
                unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                ::count(&this->privateTypes,&local_70), sVar3 == 0)) {
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                (__return_storage_ptr__,&local_70);
    }
    __gnu_cxx::
    __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
    ::operator++(&__end2);
  }
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<HeapType> TypeMerging::getPublicChildren(HeapType type) {
  std::vector<HeapType> publicChildren;
  for (auto child : type.getHeapTypeChildren()) {
    if (!child.isBasic() && !privateTypes.count(child)) {
      publicChildren.push_back(child);
    }
  }
  return publicChildren;
}